

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O3

void __thiscall
MeasurementToString_test_Test::~MeasurementToString_test_Test(MeasurementToString_test_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MeasurementToString, test)
{
    measurement density = 10.0 * kg / m.pow(3);
    measurement meas2 = 2.7 * puMW;

    auto str1 = to_string(density);
    auto str2 = to_string(meas2);

    // from google tests
    EXPECT_EQ(str1, "10 kg/m^3");
    EXPECT_EQ(str2, "2.7 puMW");
}